

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse2::
     BVHNIntersector1<4,_1,_false,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  IntersectFunc *pp_Var2;
  float *pfVar3;
  Geometry *pGVar4;
  RTCIntersectArguments *pRVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  undefined4 uVar10;
  undefined1 (*pauVar11) [16];
  undefined1 (*pauVar12) [16];
  ulong uVar14;
  int *piVar15;
  RTCRayQueryContext *pRVar16;
  ulong uVar17;
  Intersectors *pIVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar37;
  uint uVar38;
  float fVar39;
  float fVar40;
  float fVar48;
  float fVar49;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar50;
  undefined1 auVar47 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar57;
  float fVar63;
  float fVar64;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar65;
  undefined1 auVar62 [16];
  float fVar66;
  float fVar69;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  int iVar81;
  float fVar82;
  int iVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_115c;
  undefined1 local_1158 [16];
  float local_1148;
  uint uStack_1144;
  int iStack_1140;
  int iStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  RTCFilterFunctionNArguments local_1128;
  Geometry *local_10f8;
  Scene *local_10f0;
  float local_10e8;
  undefined4 local_10e4;
  float local_10e0;
  float local_10dc;
  float local_10d8;
  undefined4 local_10d4;
  uint local_10d0;
  uint local_10cc;
  uint local_10c8;
  undefined1 local_10b8 [8];
  float fStack_10b0;
  float fStack_10ac;
  undefined1 local_10a8 [16];
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  undefined1 local_1068 [16];
  float local_1058 [4];
  float local_1048 [4];
  float local_1038 [4];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008 [4];
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  uint local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  ulong uVar13;
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar11 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar66 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar69 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar36 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar80 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    fVar39 = (ray->super_RayK<1>).dir.field_0.m128[0];
    fVar40 = (ray->super_RayK<1>).dir.field_0.m128[1];
    fVar48 = (ray->super_RayK<1>).dir.field_0.m128[2];
    fVar49 = (ray->super_RayK<1>).dir.field_0.m128[3];
    fVar50 = 0.0;
    if (0.0 <= fVar80) {
      fVar50 = fVar80;
    }
    fVar80 = (ray->super_RayK<1>).tfar;
    fVar82 = 0.0;
    if (0.0 <= fVar80) {
      fVar82 = fVar80;
    }
    uVar22 = -(uint)((float)DAT_01f80d30 <= ABS(fVar39));
    uVar23 = -(uint)(DAT_01f80d30._4_4_ <= ABS(fVar40));
    uVar24 = -(uint)(DAT_01f80d30._8_4_ <= ABS(fVar48));
    uVar25 = -(uint)(DAT_01f80d30._12_4_ <= ABS(fVar49));
    auVar30._0_4_ = (uint)fVar39 & uVar22;
    auVar30._4_4_ = (uint)fVar40 & uVar23;
    auVar30._8_4_ = (uint)fVar48 & uVar24;
    auVar30._12_4_ = (uint)fVar49 & uVar25;
    auVar51._0_4_ = ~uVar22 & (uint)(float)DAT_01f80d30;
    auVar51._4_4_ = ~uVar23 & (uint)DAT_01f80d30._4_4_;
    auVar51._8_4_ = ~uVar24 & (uint)DAT_01f80d30._8_4_;
    auVar51._12_4_ = ~uVar25 & (uint)DAT_01f80d30._12_4_;
    auVar51 = auVar51 | auVar30;
    auVar41 = rcpps(auVar30,auVar51);
    fVar84 = auVar41._0_4_;
    fVar87 = auVar41._4_4_;
    fVar90 = auVar41._8_4_;
    fVar84 = (1.0 - auVar51._0_4_ * fVar84) * fVar84 + fVar84;
    fVar87 = (1.0 - auVar51._4_4_ * fVar87) * fVar87 + fVar87;
    fVar90 = (1.0 - auVar51._8_4_ * fVar90) * fVar90 + fVar90;
    bVar6 = fVar84 < 0.0;
    uVar17 = (ulong)(fVar87 < 0.0) << 4 | 0x20;
    uVar21 = (ulong)(fVar90 < 0.0) << 4 | 0x40;
    auVar41._4_4_ = fVar82;
    auVar41._0_4_ = fVar82;
    auVar41._8_4_ = fVar82;
    auVar41._12_4_ = fVar82;
    _local_f88 = mm_lookupmask_ps._240_8_;
    _uStack_f80 = mm_lookupmask_ps._248_8_;
    local_f98 = fVar36;
    fStack_f94 = fVar36;
    fStack_f90 = fVar36;
    fStack_f8c = fVar36;
    local_fa8 = fVar50;
    fStack_fa4 = fVar50;
    fStack_fa0 = fVar50;
    fStack_f9c = fVar50;
    local_fb8 = fVar90;
    fStack_fb4 = fVar90;
    fStack_fb0 = fVar90;
    fStack_fac = fVar90;
    local_fc8 = fVar66;
    fStack_fc4 = fVar66;
    fStack_fc0 = fVar66;
    fStack_fbc = fVar66;
    local_fd8 = fVar69;
    fStack_fd4 = fVar69;
    fStack_fd0 = fVar69;
    fStack_fcc = fVar69;
    local_fe8 = fVar84;
    fStack_fe4 = fVar84;
    fStack_fe0 = fVar84;
    fStack_fdc = fVar84;
    local_ff8 = fVar87;
    fStack_ff4 = fVar87;
    fStack_ff0 = fVar87;
    fStack_fec = fVar87;
    fVar113 = fVar87;
    fVar111 = fVar87;
    fVar109 = fVar87;
    fVar103 = fVar84;
    fVar65 = fVar84;
    fVar37 = fVar84;
    fVar102 = fVar69;
    fVar100 = fVar69;
    fVar98 = fVar69;
    fVar96 = fVar66;
    fVar95 = fVar66;
    fVar94 = fVar66;
    fVar92 = fVar90;
    fVar89 = fVar90;
    fVar86 = fVar90;
    fVar82 = fVar50;
    fVar49 = fVar50;
    fVar48 = fVar50;
    fVar40 = fVar36;
    fVar39 = fVar36;
    fVar80 = fVar36;
LAB_00d00e13:
    do {
      pauVar12 = pauVar11 + -1;
      pauVar11 = pauVar11 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar12 + 8) < *pfVar1 || *(float *)((long)*pauVar12 + 8) == *pfVar1) {
        pIVar18 = *(Intersectors **)*pauVar11;
        while (((ulong)pIVar18 & 8) == 0) {
          pp_Var2 = &(pIVar18->intersector1).intersect + (ulong)bVar6 * 2;
          auVar68._0_4_ = (*(float *)pp_Var2 - fVar94) * fVar37;
          auVar68._4_4_ = (*(float *)((long)pp_Var2 + 4) - fVar95) * fVar65;
          auVar68._8_4_ = (*(float *)(pp_Var2 + 1) - fVar96) * fVar103;
          auVar68._12_4_ = (*(float *)((long)pp_Var2 + 0xc) - fVar66) * fVar84;
          pfVar1 = (float *)((long)&(pIVar18->intersector1).intersect + uVar17);
          auVar42._0_4_ = (*pfVar1 - fVar98) * fVar109;
          auVar42._4_4_ = (pfVar1[1] - fVar100) * fVar111;
          auVar42._8_4_ = (pfVar1[2] - fVar102) * fVar113;
          auVar42._12_4_ = (pfVar1[3] - fVar69) * fVar87;
          auVar30 = maxps(auVar68,auVar42);
          pfVar1 = (float *)((long)&(pIVar18->intersector1).intersect + uVar21);
          auVar43._0_4_ = (*pfVar1 - fVar80) * fVar86;
          auVar43._4_4_ = (pfVar1[1] - fVar39) * fVar89;
          auVar43._8_4_ = (pfVar1[2] - fVar40) * fVar92;
          auVar43._12_4_ = (pfVar1[3] - fVar36) * fVar90;
          auVar61._4_4_ = fVar49;
          auVar61._0_4_ = fVar48;
          auVar61._8_4_ = fVar82;
          auVar61._12_4_ = fVar50;
          auVar51 = maxps(auVar43,auVar61);
          _local_10b8 = maxps(auVar30,auVar51);
          pfVar1 = (float *)((long)&(pIVar18->intersector1).intersect + ((ulong)bVar6 * 0x10 ^ 0x10)
                            );
          auVar44._0_4_ = (*pfVar1 - fVar94) * fVar37;
          auVar44._4_4_ = (pfVar1[1] - fVar95) * fVar65;
          auVar44._8_4_ = (pfVar1[2] - fVar96) * fVar103;
          auVar44._12_4_ = (pfVar1[3] - fVar66) * fVar84;
          pfVar1 = (float *)((long)&(pIVar18->intersector1).intersect + (uVar17 ^ 0x10));
          auVar52._0_4_ = (*pfVar1 - fVar98) * fVar109;
          auVar52._4_4_ = (pfVar1[1] - fVar100) * fVar111;
          auVar52._8_4_ = (pfVar1[2] - fVar102) * fVar113;
          auVar52._12_4_ = (pfVar1[3] - fVar69) * fVar87;
          auVar30 = minps(auVar44,auVar52);
          pfVar1 = (float *)((long)&(pIVar18->intersector1).intersect + (uVar21 ^ 0x10));
          auVar53._0_4_ = (*pfVar1 - fVar80) * fVar86;
          auVar53._4_4_ = (pfVar1[1] - fVar39) * fVar89;
          auVar53._8_4_ = (pfVar1[2] - fVar40) * fVar92;
          auVar53._12_4_ = (pfVar1[3] - fVar36) * fVar90;
          auVar51 = minps(auVar53,auVar41);
          auVar30 = minps(auVar30,auVar51);
          auVar71._4_4_ = -(uint)(local_10b8._4_4_ <= auVar30._4_4_);
          auVar71._0_4_ = -(uint)(local_10b8._0_4_ <= auVar30._0_4_);
          auVar71._8_4_ = -(uint)(local_10b8._8_4_ <= auVar30._8_4_);
          auVar71._12_4_ = -(uint)(local_10b8._12_4_ <= auVar30._12_4_);
          uVar22 = movmskps((int)This,auVar71);
          This = (Intersectors *)(ulong)uVar22;
          if (uVar22 == 0) {
            if (pauVar11 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_00d00e13;
          }
          uVar14 = (ulong)pIVar18 & 0xfffffffffffffff0;
          This = (Intersectors *)0x0;
          if ((byte)uVar22 != 0) {
            for (; ((byte)uVar22 >> (long)This & 1) == 0;
                This = (Intersectors *)((long)&This->ptr + 1)) {
            }
          }
          pIVar18 = *(Intersectors **)(uVar14 + (long)This * 8);
          uVar22 = (uVar22 & 0xff) - 1 & uVar22 & 0xff;
          if (uVar22 != 0) {
            uVar23 = *(uint *)(local_10b8 + (long)This * 4);
            lVar20 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
              }
            }
            This = *(Intersectors **)(uVar14 + lVar20 * 8);
            uVar24 = *(uint *)(local_10b8 + lVar20 * 4);
            uVar22 = uVar22 - 1 & uVar22;
            if (uVar22 == 0) {
              if (uVar23 < uVar24) {
                *(Intersectors **)*pauVar11 = This;
                *(uint *)((long)*pauVar11 + 8) = uVar24;
                pauVar11 = pauVar11 + 1;
              }
              else {
                *(Intersectors **)*pauVar11 = pIVar18;
                *(uint *)((long)*pauVar11 + 8) = uVar23;
                pauVar11 = pauVar11 + 1;
                pIVar18 = This;
              }
            }
            else {
              auVar31._8_4_ = uVar23;
              auVar31._0_8_ = pIVar18;
              auVar31._12_4_ = 0;
              auVar45._8_4_ = uVar24;
              auVar45._0_8_ = This;
              auVar45._12_4_ = 0;
              This = (Intersectors *)0x0;
              if (uVar22 != 0) {
                for (; (uVar22 >> (long)This & 1) == 0;
                    This = (Intersectors *)((long)&This->ptr + 1)) {
                }
              }
              uVar19 = *(ulong *)(uVar14 + (long)This * 8);
              iVar81 = *(int *)(local_10b8 + (long)This * 4);
              auVar54._8_4_ = iVar81;
              auVar54._0_8_ = uVar19;
              auVar54._12_4_ = 0;
              auVar58._8_4_ = -(uint)((int)uVar23 < (int)uVar24);
              uVar22 = uVar22 - 1 & uVar22;
              if (uVar22 == 0) {
                auVar58._4_4_ = auVar58._8_4_;
                auVar58._0_4_ = auVar58._8_4_;
                auVar58._12_4_ = auVar58._8_4_;
                auVar30 = auVar31 & auVar58 | ~auVar58 & auVar45;
                auVar51 = auVar45 & auVar58 | ~auVar58 & auVar31;
                auVar59._8_4_ = -(uint)(auVar30._8_4_ < iVar81);
                auVar59._0_8_ = CONCAT44(auVar59._8_4_,auVar59._8_4_);
                auVar59._12_4_ = auVar59._8_4_;
                pIVar18 = (Intersectors *)(~auVar59._0_8_ & uVar19 | auVar30._0_8_ & auVar59._0_8_);
                auVar30 = auVar54 & auVar59 | ~auVar59 & auVar30;
                auVar32._8_4_ = -(uint)(auVar51._8_4_ < auVar30._8_4_);
                auVar32._4_4_ = auVar32._8_4_;
                auVar32._0_4_ = auVar32._8_4_;
                auVar32._12_4_ = auVar32._8_4_;
                *pauVar11 = ~auVar32 & auVar51 | auVar30 & auVar32;
                pauVar11[1] = auVar51 & auVar32 | ~auVar32 & auVar30;
                pauVar11 = pauVar11 + 2;
              }
              else {
                This = (Intersectors *)0x0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> (long)This & 1) == 0;
                      This = (Intersectors *)((long)&This->ptr + 1)) {
                  }
                }
                iVar83 = *(int *)(local_10b8 + (long)This * 4);
                auVar67._8_4_ = iVar83;
                auVar67._0_8_ = *(undefined8 *)(uVar14 + (long)This * 8);
                auVar67._12_4_ = 0;
                auVar60._4_4_ = auVar58._8_4_;
                auVar60._0_4_ = auVar58._8_4_;
                auVar60._8_4_ = auVar58._8_4_;
                auVar60._12_4_ = auVar58._8_4_;
                auVar30 = auVar31 & auVar60 | ~auVar60 & auVar45;
                auVar51 = auVar45 & auVar60 | ~auVar60 & auVar31;
                auVar70._0_4_ = -(uint)(iVar81 < iVar83);
                auVar70._4_4_ = -(uint)(iVar81 < iVar83);
                auVar70._8_4_ = -(uint)(iVar81 < iVar83);
                auVar70._12_4_ = -(uint)(iVar81 < iVar83);
                auVar61 = auVar54 & auVar70 | ~auVar70 & auVar67;
                auVar71 = ~auVar70 & auVar54 | auVar67 & auVar70;
                auVar55._8_4_ = -(uint)(auVar51._8_4_ < auVar71._8_4_);
                auVar55._4_4_ = auVar55._8_4_;
                auVar55._0_4_ = auVar55._8_4_;
                auVar55._12_4_ = auVar55._8_4_;
                auVar68 = auVar51 & auVar55 | ~auVar55 & auVar71;
                auVar46._8_4_ = -(uint)(auVar30._8_4_ < auVar61._8_4_);
                auVar46._0_8_ = CONCAT44(auVar46._8_4_,auVar46._8_4_);
                auVar46._12_4_ = auVar46._8_4_;
                pIVar18 = (Intersectors *)
                          (auVar30._0_8_ & auVar46._0_8_ | ~auVar46._0_8_ & auVar61._0_8_);
                auVar30 = ~auVar46 & auVar30 | auVar61 & auVar46;
                auVar33._8_4_ = -(uint)(auVar30._8_4_ < auVar68._8_4_);
                auVar33._4_4_ = auVar33._8_4_;
                auVar33._0_4_ = auVar33._8_4_;
                auVar33._12_4_ = auVar33._8_4_;
                *pauVar11 = ~auVar55 & auVar51 | auVar71 & auVar55;
                pauVar11[1] = ~auVar33 & auVar30 | auVar68 & auVar33;
                pauVar11[2] = auVar30 & auVar33 | ~auVar33 & auVar68;
                pauVar11 = pauVar11 + 3;
              }
            }
          }
        }
        uVar14 = (ulong)((uint)pIVar18 & 0xf);
        if (uVar14 != 8) {
          uVar19 = (ulong)pIVar18 & 0xfffffffffffffff0;
          lVar20 = 0;
          pauVar12 = pauVar11;
          do {
            This = (Intersectors *)(lVar20 * 0xb0);
            pfVar1 = (float *)((long)&(This->intersector4_nofilter).name + uVar19);
            fVar66 = *pfVar1;
            fVar69 = pfVar1[1];
            fVar36 = pfVar1[2];
            fVar80 = pfVar1[3];
            pfVar1 = (float *)((long)&(This->intersector4).intersect + uVar19);
            fVar39 = *pfVar1;
            fVar40 = pfVar1[1];
            fVar48 = pfVar1[2];
            fVar49 = pfVar1[3];
            pfVar1 = (float *)((long)&(This->intersector4_nofilter).intersect + uVar19);
            fVar50 = *pfVar1;
            fVar82 = pfVar1[1];
            fVar86 = pfVar1[2];
            fVar89 = pfVar1[3];
            pfVar1 = (float *)((long)&(This->intersector4).name + uVar19);
            fVar92 = *pfVar1;
            fVar90 = pfVar1[1];
            fVar94 = pfVar1[2];
            fVar95 = pfVar1[3];
            fVar108 = fVar50 * fVar92 - fVar66 * fVar39;
            fVar110 = fVar82 * fVar90 - fVar69 * fVar40;
            fVar112 = fVar86 * fVar94 - fVar36 * fVar48;
            fVar114 = fVar89 * fVar95 - fVar80 * fVar49;
            pfVar1 = (float *)((long)&(This->intersector4_filter).occluded + uVar19);
            fVar96 = *pfVar1;
            fVar98 = pfVar1[1];
            fVar100 = pfVar1[2];
            fVar102 = pfVar1[3];
            pfVar1 = (float *)((long)&This->ptr + uVar19);
            pfVar3 = (float *)((long)&(This->collider).collide + uVar19);
            fVar37 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar65 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar103 = (ray->super_RayK<1>).org.field_0.m128[2];
            fVar84 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar109 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar111 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar29 = *pfVar1 - fVar37;
            fVar34 = pfVar1[1] - fVar37;
            fVar35 = pfVar1[2] - fVar37;
            fVar37 = pfVar1[3] - fVar37;
            fVar57 = *pfVar3 - fVar65;
            fVar63 = pfVar3[1] - fVar65;
            fVar64 = pfVar3[2] - fVar65;
            fVar65 = pfVar3[3] - fVar65;
            fVar104 = fVar29 * fVar109 - fVar84 * fVar57;
            fVar105 = fVar34 * fVar109 - fVar84 * fVar63;
            fVar106 = fVar35 * fVar109 - fVar84 * fVar64;
            fVar107 = fVar37 * fVar109 - fVar84 * fVar65;
            pfVar1 = (float *)((long)&(This->intersector1).pointQuery + uVar19);
            fVar113 = *pfVar1;
            fVar87 = pfVar1[1];
            fVar7 = pfVar1[2];
            fVar8 = pfVar1[3];
            local_1018._0_4_ = fVar66 * fVar113 - fVar92 * fVar96;
            local_1018._4_4_ = fVar69 * fVar87 - fVar90 * fVar98;
            local_1018._8_4_ = fVar36 * fVar7 - fVar94 * fVar100;
            local_1018._12_4_ = fVar80 * fVar8 - fVar95 * fVar102;
            pfVar1 = (float *)((long)&(This->intersector1).intersect + uVar19);
            fVar97 = *pfVar1 - fVar103;
            fVar99 = pfVar1[1] - fVar103;
            fVar101 = pfVar1[2] - fVar103;
            fVar103 = pfVar1[3] - fVar103;
            fVar85 = fVar84 * fVar97 - fVar29 * fVar111;
            fVar88 = fVar84 * fVar99 - fVar34 * fVar111;
            fVar91 = fVar84 * fVar101 - fVar35 * fVar111;
            fVar93 = fVar84 * fVar103 - fVar37 * fVar111;
            local_1008[0] = fVar39 * fVar96 - fVar50 * fVar113;
            local_1008[1] = fVar40 * fVar98 - fVar82 * fVar87;
            local_1008[2] = fVar48 * fVar100 - fVar86 * fVar7;
            local_1008[3] = fVar49 * fVar102 - fVar89 * fVar8;
            fVar73 = fVar111 * fVar57 - fVar109 * fVar97;
            fVar74 = fVar111 * fVar63 - fVar109 * fVar99;
            fVar75 = fVar111 * fVar64 - fVar109 * fVar101;
            fVar76 = fVar111 * fVar65 - fVar109 * fVar103;
            fVar77 = fVar109 * local_1018._0_4_ + fVar111 * local_1008[0] + fVar108 * fVar84;
            fVar78 = fVar109 * local_1018._4_4_ + fVar111 * local_1008[1] + fVar110 * fVar84;
            fVar79 = fVar109 * local_1018._8_4_ + fVar111 * local_1008[2] + fVar112 * fVar84;
            fVar84 = fVar109 * local_1018._12_4_ + fVar111 * local_1008[3] + fVar114 * fVar84;
            uVar23 = (uint)fVar77 & 0x80000000;
            uVar24 = (uint)fVar78 & 0x80000000;
            uVar25 = (uint)fVar79 & 0x80000000;
            uVar38 = (uint)fVar84 & 0x80000000;
            local_10b8._0_4_ = (uint)(fVar96 * fVar73 + fVar50 * fVar85 + fVar66 * fVar104) ^ uVar23
            ;
            local_10b8._4_4_ = (uint)(fVar98 * fVar74 + fVar82 * fVar88 + fVar69 * fVar105) ^ uVar24
            ;
            fStack_10b0 = (float)((uint)(fVar100 * fVar75 + fVar86 * fVar91 + fVar36 * fVar106) ^
                                 uVar25);
            fStack_10ac = (float)((uint)(fVar102 * fVar76 + fVar89 * fVar93 + fVar80 * fVar107) ^
                                 uVar38);
            local_10a8._0_4_ =
                 (float)((uint)(fVar73 * fVar113 + fVar85 * fVar39 + fVar104 * fVar92) ^ uVar23);
            local_10a8._4_4_ =
                 (float)((uint)(fVar74 * fVar87 + fVar88 * fVar40 + fVar105 * fVar90) ^ uVar24);
            local_10a8._8_4_ =
                 (float)((uint)(fVar75 * fVar7 + fVar91 * fVar48 + fVar106 * fVar94) ^ uVar25);
            local_10a8._12_4_ =
                 (float)((uint)(fVar76 * fVar8 + fVar93 * fVar49 + fVar107 * fVar95) ^ uVar38);
            fVar66 = ABS(fVar77);
            fVar69 = ABS(fVar78);
            local_1088._0_8_ = CONCAT44(fVar78,fVar77) & 0x7fffffff7fffffff;
            local_1088._8_4_ = ABS(fVar79);
            local_1088._12_4_ = ABS(fVar84);
            auVar72._0_4_ =
                 -(uint)((float)local_10b8._0_4_ + local_10a8._0_4_ <= fVar66) &
                 -(uint)((0.0 <= local_10a8._0_4_ && 0.0 <= (float)local_10b8._0_4_) &&
                        fVar77 != 0.0) & local_f88;
            auVar72._4_4_ =
                 -(uint)((float)local_10b8._4_4_ + local_10a8._4_4_ <= fVar69) &
                 -(uint)((0.0 <= local_10a8._4_4_ && 0.0 <= (float)local_10b8._4_4_) &&
                        fVar78 != 0.0) & uStack_f84;
            auVar72._8_4_ =
                 -(uint)(fStack_10b0 + local_10a8._8_4_ <= local_1088._8_4_) &
                 -(uint)((0.0 <= local_10a8._8_4_ && 0.0 <= fStack_10b0) && fVar79 != 0.0) &
                 uStack_f80;
            auVar72._12_4_ =
                 -(uint)(fStack_10ac + local_10a8._12_4_ <= local_1088._12_4_) &
                 -(uint)((0.0 <= local_10a8._12_4_ && 0.0 <= fStack_10ac) && fVar84 != 0.0) &
                 uStack_f7c;
            uVar22 = movmskps((int)pauVar12,auVar72);
            pauVar12 = (undefined1 (*) [16])(ulong)uVar22;
            if (uVar22 != 0) {
              local_1098 = (float)(uVar23 ^ (uint)(fVar29 * fVar108 +
                                                  fVar57 * local_1018._0_4_ + fVar97 * local_1008[0]
                                                  ));
              fStack_1094 = (float)(uVar24 ^ (uint)(fVar34 * fVar110 +
                                                   fVar63 * local_1018._4_4_ +
                                                   fVar99 * local_1008[1]));
              fStack_1090 = (float)(uVar25 ^ (uint)(fVar35 * fVar112 +
                                                   fVar64 * local_1018._8_4_ +
                                                   fVar101 * local_1008[2]));
              fStack_108c = (float)(uVar38 ^ (uint)(fVar37 * fVar114 +
                                                   fVar65 * local_1018._12_4_ +
                                                   fVar103 * local_1008[3]));
              fVar36 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar80 = (ray->super_RayK<1>).tfar;
              uVar23 = (ray->super_RayK<1>).mask;
              iVar81 = (ray->super_RayK<1>).id;
              iVar83 = (ray->super_RayK<1>).flags;
              auVar56._0_4_ =
                   -(uint)(local_1098 <= fVar80 * fVar66 && fVar36 * fVar66 < local_1098) &
                   auVar72._0_4_;
              auVar56._4_4_ =
                   -(uint)(fStack_1094 <= fVar80 * fVar69 && fVar36 * fVar69 < fStack_1094) &
                   auVar72._4_4_;
              auVar56._8_4_ =
                   -(uint)(fStack_1090 <= fVar80 * local_1088._8_4_ &&
                          fVar36 * local_1088._8_4_ < fStack_1090) & auVar72._8_4_;
              auVar56._12_4_ =
                   -(uint)(fStack_108c <= fVar80 * local_1088._12_4_ &&
                          fVar36 * local_1088._12_4_ < fStack_108c) & auVar72._12_4_;
              uVar22 = movmskps(uVar22,auVar56);
              pauVar12 = (undefined1 (*) [16])(ulong)uVar22;
              if (uVar22 != 0) {
                local_1068 = auVar56;
                local_1028._4_4_ = fVar110;
                local_1028._0_4_ = fVar108;
                local_1028._8_4_ = fVar112;
                local_1028._12_4_ = fVar114;
                local_10f0 = context->scene;
                local_1158 = auVar56;
                auVar41 = rcpps(local_1028,local_1088);
                fVar40 = auVar41._0_4_;
                fVar48 = auVar41._4_4_;
                fVar49 = auVar41._8_4_;
                fVar50 = auVar41._12_4_;
                fVar40 = (1.0 - fVar66 * fVar40) * fVar40 + fVar40;
                fVar48 = (1.0 - fVar69 * fVar48) * fVar48 + fVar48;
                fVar49 = (1.0 - local_1088._8_4_ * fVar49) * fVar49 + fVar49;
                fVar50 = (1.0 - local_1088._12_4_ * fVar50) * fVar50 + fVar50;
                fVar66 = local_1098 * fVar40;
                fVar69 = fStack_1094 * fVar48;
                fVar36 = fStack_1090 * fVar49;
                fVar39 = fStack_108c * fVar50;
                local_1038[0] = fVar66;
                local_1038[1] = fVar69;
                local_1038[2] = fVar36;
                local_1038[3] = fVar39;
                local_1058[0] = (float)local_10b8._0_4_ * fVar40;
                local_1058[1] = (float)local_10b8._4_4_ * fVar48;
                local_1058[2] = fStack_10b0 * fVar49;
                local_1058[3] = fStack_10ac * fVar50;
                local_1048[0] = fVar40 * local_10a8._0_4_;
                local_1048[1] = fVar48 * local_10a8._4_4_;
                local_1048[2] = fVar49 * local_10a8._8_4_;
                local_1048[3] = fVar50 * local_10a8._12_4_;
                auVar26._0_4_ = auVar56._0_4_ & (uint)fVar66;
                auVar26._4_4_ = auVar56._4_4_ & (uint)fVar69;
                auVar26._8_4_ = auVar56._8_4_ & (uint)fVar36;
                auVar26._12_4_ = auVar56._12_4_ & (uint)fVar39;
                auVar62._0_8_ = CONCAT44(~auVar56._4_4_,~auVar56._0_4_) & 0x7f8000007f800000;
                auVar62._8_4_ = ~auVar56._8_4_ & 0x7f800000;
                auVar62._12_4_ = ~auVar56._12_4_ & 0x7f800000;
                auVar62 = auVar62 | auVar26;
                auVar47._4_4_ = auVar62._0_4_;
                auVar47._0_4_ = auVar62._4_4_;
                auVar47._8_4_ = auVar62._12_4_;
                auVar47._12_4_ = auVar62._8_4_;
                auVar41 = minps(auVar47,auVar62);
                auVar27._0_8_ = auVar41._8_8_;
                auVar27._8_4_ = auVar41._0_4_;
                auVar27._12_4_ = auVar41._4_4_;
                auVar41 = minps(auVar27,auVar41);
                auVar28._0_8_ =
                     CONCAT44(-(uint)(auVar41._4_4_ == auVar62._4_4_) & auVar56._4_4_,
                              -(uint)(auVar41._0_4_ == auVar62._0_4_) & auVar56._0_4_);
                auVar28._8_4_ = -(uint)(auVar41._8_4_ == auVar62._8_4_) & auVar56._8_4_;
                auVar28._12_4_ = -(uint)(auVar41._12_4_ == auVar62._12_4_) & auVar56._12_4_;
                iVar9 = movmskps((int)local_10f0,auVar28);
                if (iVar9 != 0) {
                  auVar56._8_4_ = auVar28._8_4_;
                  auVar56._0_8_ = auVar28._0_8_;
                  auVar56._12_4_ = auVar28._12_4_;
                }
                This = (Intersectors *)((long)&This->ptr + uVar19);
                uVar10 = movmskps(iVar9,auVar56);
                uVar13 = CONCAT44((int)((ulong)local_10f0 >> 0x20),uVar10);
                piVar15 = (int *)0x0;
                uVar22 = uVar23;
                if (uVar13 != 0) {
                  for (; (uVar13 >> (long)piVar15 & 1) == 0; piVar15 = (int *)((long)piVar15 + 1)) {
                  }
                }
                do {
                  uVar24 = *(uint *)((long)&(This->intersector8).occluded + (long)piVar15 * 4);
                  pGVar4 = (local_10f0->geometries).items[uVar24].ptr;
                  if ((pGVar4->mask & uVar22) == 0) {
                    *(undefined4 *)(local_1158 + (long)piVar15 * 4) = 0;
                  }
                  else {
                    pRVar5 = context->args;
                    if (pRVar5->filter == (RTCFilterFunctionN)0x0) {
                      pRVar16 = context->user;
                      if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar66 = local_1058[(long)piVar15];
                        fVar69 = local_1048[(long)piVar15];
                        (ray->super_RayK<1>).tfar = local_1038[(long)piVar15];
                        (ray->Ng).field_0.field_0.x = *(float *)(local_1028 + (long)piVar15 * 4);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_1018 + (long)piVar15 * 4);
                        (ray->Ng).field_0.field_0.z = local_1008[(long)piVar15];
                        ray->u = fVar66;
                        ray->v = fVar69;
                        uVar22 = *(uint *)((long)&(This->intersector8_filter).intersect +
                                          (long)piVar15 * 4);
                        This = (Intersectors *)(ulong)uVar22;
                        ray->primID = uVar22;
                        ray->geomID = uVar24;
                        ray->instID[0] = pRVar16->instID[0];
                        pauVar12 = (undefined1 (*) [16])(ulong)pRVar16->instPrimID[0];
                        ray->instPrimID[0] = pRVar16->instPrimID[0];
                        break;
                      }
                      local_1148 = fVar80;
                      uStack_1144 = uVar23;
                      iStack_1140 = iVar81;
                      iStack_113c = iVar83;
                      local_1138 = fVar66;
                      fStack_1134 = fVar69;
                      fStack_1130 = fVar36;
                      fStack_112c = fVar39;
                    }
                    else {
                      local_1148 = fVar80;
                      uStack_1144 = uVar23;
                      iStack_1140 = iVar81;
                      iStack_113c = iVar83;
                      local_1138 = fVar66;
                      fStack_1134 = fVar69;
                      fStack_1130 = fVar36;
                      fStack_112c = fVar39;
                      pRVar16 = context->user;
                    }
                    local_10e8 = *(float *)(local_1028 + (long)piVar15 * 4);
                    local_10e4 = *(undefined4 *)(local_1018 + (long)piVar15 * 4);
                    local_10e0 = local_1008[(long)piVar15];
                    local_10dc = local_1058[(long)piVar15];
                    local_10d8 = local_1048[(long)piVar15];
                    local_10d4 = *(undefined4 *)
                                  ((long)&(This->intersector8_filter).intersect + (long)piVar15 * 4)
                    ;
                    local_10d0 = uVar24;
                    local_10cc = pRVar16->instID[0];
                    local_10c8 = pRVar16->instPrimID[0];
                    (ray->super_RayK<1>).tfar = local_1038[(long)piVar15];
                    local_115c = -1;
                    local_1128.valid = &local_115c;
                    local_1128.geometryUserPtr = pGVar4->userPtr;
                    local_1128.context = pRVar16;
                    local_1128.ray = (RTCRayN *)ray;
                    local_1128.hit = (RTCHitN *)&local_10e8;
                    local_1128.N = 1;
                    local_10f8 = pGVar4;
                    local_1148 = fVar80;
                    uStack_1144 = uVar23;
                    iStack_1140 = iVar81;
                    iStack_113c = iVar83;
                    local_1138 = fVar66;
                    fStack_1134 = fVar69;
                    fStack_1130 = fVar36;
                    fStack_112c = fVar39;
                    if (((pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*pGVar4->intersectionFilterN)(&local_1128), *local_1128.valid != 0)) &&
                       ((pRVar5->filter == (RTCFilterFunctionN)0x0 ||
                        ((((pRVar5->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((local_10f8->field_8).field_0x2 & 0x40) == 0)) ||
                         ((*pRVar5->filter)(&local_1128), *local_1128.valid != 0)))))) {
                      (((Vec3f *)((long)local_1128.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1128.hit;
                      (((Vec3f *)((long)local_1128.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1128.hit + 4);
                      (((Vec3f *)((long)local_1128.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1128.hit + 8);
                      *(float *)((long)local_1128.ray + 0x3c) = *(float *)(local_1128.hit + 0xc);
                      *(float *)((long)local_1128.ray + 0x40) = *(float *)(local_1128.hit + 0x10);
                      *(float *)((long)local_1128.ray + 0x44) = *(float *)(local_1128.hit + 0x14);
                      *(float *)((long)local_1128.ray + 0x48) = *(float *)(local_1128.hit + 0x18);
                      *(float *)((long)local_1128.ray + 0x4c) = *(float *)(local_1128.hit + 0x1c);
                      *(float *)((long)local_1128.ray + 0x50) = *(float *)(local_1128.hit + 0x20);
                    }
                    else {
                      (ray->super_RayK<1>).tfar = local_1148;
                    }
                    *(undefined4 *)(local_1158 + (long)piVar15 * 4) = 0;
                    fVar80 = (ray->super_RayK<1>).tfar;
                    uVar23 = (ray->super_RayK<1>).mask;
                    iVar81 = (ray->super_RayK<1>).id;
                    iVar83 = (ray->super_RayK<1>).flags;
                    local_1158._0_4_ = -(uint)(local_1138 <= fVar80) & local_1158._0_4_;
                    local_1158._4_4_ = -(uint)(fStack_1134 <= fVar80) & local_1158._4_4_;
                    local_1158._8_4_ = -(uint)(fStack_1130 <= fVar80) & local_1158._8_4_;
                    local_1158._12_4_ = -(uint)(fStack_112c <= fVar80) & local_1158._12_4_;
                    uVar22 = (ray->super_RayK<1>).mask;
                    fVar66 = local_1138;
                    fVar69 = fStack_1134;
                    fVar36 = fStack_1130;
                    fVar39 = fStack_112c;
                  }
                  local_1148 = fVar80;
                  uStack_1144 = uVar23;
                  iStack_1140 = iVar81;
                  iStack_113c = iVar83;
                  uVar23 = movmskps((int)piVar15,local_1158);
                  pauVar12 = (undefined1 (*) [16])(ulong)uVar23;
                  if (uVar23 == 0) break;
                  local_1138 = fVar66;
                  fStack_1134 = fVar69;
                  fStack_1130 = fVar36;
                  fStack_112c = fVar39;
                  BVHNIntersector1<4,1,false,embree::sse2::ArrayIntersector1<embree::sse2::TriangleMIntersector1Moeller<4,true>>>
                  ::intersect();
                  piVar15 = local_1128.valid;
                  fVar80 = local_1148;
                  uVar23 = uStack_1144;
                  iVar81 = iStack_1140;
                  iVar83 = iStack_113c;
                  fVar66 = local_1138;
                  fVar69 = fStack_1134;
                  fVar36 = fStack_1130;
                  fVar39 = fStack_112c;
                } while( true );
              }
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 != uVar14 - 8);
        }
        fVar66 = (ray->super_RayK<1>).tfar;
        auVar41._4_4_ = fVar66;
        auVar41._0_4_ = fVar66;
        auVar41._8_4_ = fVar66;
        auVar41._12_4_ = fVar66;
        fVar80 = local_f98;
        fVar39 = fStack_f94;
        fVar40 = fStack_f90;
        fVar36 = fStack_f8c;
        fVar48 = local_fa8;
        fVar49 = fStack_fa4;
        fVar82 = fStack_fa0;
        fVar50 = fStack_f9c;
        fVar86 = local_fb8;
        fVar89 = fStack_fb4;
        fVar92 = fStack_fb0;
        fVar90 = fStack_fac;
        fVar94 = local_fc8;
        fVar95 = fStack_fc4;
        fVar96 = fStack_fc0;
        fVar66 = fStack_fbc;
        fVar98 = local_fd8;
        fVar100 = fStack_fd4;
        fVar102 = fStack_fd0;
        fVar69 = fStack_fcc;
        fVar37 = local_fe8;
        fVar65 = fStack_fe4;
        fVar103 = fStack_fe0;
        fVar84 = fStack_fdc;
        fVar109 = local_ff8;
        fVar111 = fStack_ff4;
        fVar113 = fStack_ff0;
        fVar87 = fStack_fec;
      }
    } while (pauVar11 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }